

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_data_stream.cpp
# Opt level: O1

bool __thiscall crnlib::data_stream::read_line(data_stream *this,dynamic_string *str)

{
  byte bVar1;
  undefined1 uVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  uint8 c;
  byte local_29;
  
  dynamic_string::empty(str);
  while( true ) {
    iVar3 = (*this->_vptr_data_stream[4])(this,&local_29,1);
    bVar1 = this->field_0x1a;
    if (iVar3 == 1) {
      uVar4 = (uint)local_29;
    }
    else {
      uVar4 = 0xffffffff;
    }
    this->field_0x1a = bVar1 & 0xfb;
    if (iVar3 != 1) {
      switch(str->m_len == 0) {
      case false:
        return true;
      case true:
        return false;
      }
    }
    lVar5 = 3;
    if (0xc < (int)uVar4) break;
    if (uVar4 == 0) goto LAB_00111d0d;
    if (uVar4 != 10) goto LAB_00111d00;
    switch((bVar1 & 4) == 0) {
    case true:
      return true;
    }
  }
  if (uVar4 == 0x1a) goto LAB_00111d0d;
  if (uVar4 == 0xd) {
    this->field_0x1a = bVar1 | 4;
    return true;
  }
LAB_00111d00:
  dynamic_string::append_char(str,(char)uVar4);
  lVar5 = 0;
LAB_00111d0d:
  uVar2 = (*(code *)((long)&DAT_001b3a1c + (long)(int)(&DAT_001b3a1c)[lVar5]))();
  return (bool)uVar2;
}

Assistant:

bool data_stream::read_line(dynamic_string& str) {
  str.empty();

  for (;;) {
    const int c = read_byte();

    const bool prev_got_cr = m_got_cr;
    m_got_cr = false;

    if (c < 0) {
      if (!str.is_empty())
        break;

      return false;
    } else if ((26 == c) || (!c))
      continue;
    else if (13 == c) {
      m_got_cr = true;
      break;
    } else if (10 == c) {
      if (prev_got_cr)
        continue;

      break;
    }

    str.append_char(static_cast<char>(c));
  }

  return true;
}